

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFuelReload.cpp
# Opt level: O3

bool __thiscall DIS::EngineFuelReload::operator==(EngineFuelReload *this,EngineFuelReload *rhs)

{
  undefined1 uVar1;
  undefined1 uVar3;
  undefined1 uVar4;
  ulong uVar2;
  undefined5 uVar5;
  byte bVar6;
  undefined4 in_EAX;
  undefined4 uVar7;
  undefined4 in_ECX;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [11];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar13 [12];
  undefined1 auVar18 [16];
  undefined1 auVar14 [13];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar20 [16];
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  byte bVar26;
  
  auVar11._0_4_ = -(uint)(rhs->_standardQuantity == this->_standardQuantity);
  auVar11._4_4_ = -(uint)(rhs->_maximumQuantity == this->_maximumQuantity);
  auVar11._8_4_ = -(uint)(rhs->_standardQuantityReloadTime == this->_standardQuantityReloadTime);
  auVar11._12_4_ = -(uint)(rhs->_maximumQuantityReloadTime == this->_maximumQuantityReloadTime);
  uVar2._0_1_ = this->_fuelMeasurmentUnits;
  uVar2._1_1_ = this->_fuelLocation;
  uVar2._2_1_ = this->_padding;
  uVar2._3_5_ = *(undefined5 *)&this->field_0x1b;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar2;
  uVar1 = rhs->_fuelMeasurmentUnits;
  uVar3 = rhs->_fuelLocation;
  uVar4 = rhs->_padding;
  uVar5 = *(undefined5 *)&rhs->field_0x1b;
  bVar6 = rhs->_padding ^ this->_padding;
  auVar15[0] = -(uVar1 == (undefined1)uVar2);
  cVar22 = -((char)uVar5 == (char)uVar2._3_5_);
  cVar23 = -((char)((uint5)uVar5 >> 8) == (char)((uint5)uVar2._3_5_ >> 8));
  cVar24 = -((char)((uint5)uVar5 >> 0x10) == (char)((uint5)uVar2._3_5_ >> 0x10));
  cVar25 = -((char)((uint5)uVar5 >> 0x18) == (char)((uint5)uVar2._3_5_ >> 0x18));
  bVar26 = -((char)((uint5)uVar5 >> 0x20) == (char)((uint5)uVar2._3_5_ >> 0x20));
  auVar16._0_9_ = CONCAT18(0xff,(ulong)bVar26 << 0x38);
  auVar12._0_10_ = CONCAT19(0xff,auVar16._0_9_);
  auVar12[10] = 0xff;
  auVar13[0xb] = 0xff;
  auVar13._0_11_ = auVar12;
  auVar14[0xc] = 0xff;
  auVar14._0_12_ = auVar13;
  auVar21[0xd] = 0xff;
  auVar21._0_13_ = auVar14;
  uVar8 = movmskps(in_ECX,auVar11);
  auVar21[0xe] = bVar26;
  auVar21[0xf] = bVar26;
  auVar20._14_2_ = auVar21._14_2_;
  auVar20[0xd] = cVar25;
  auVar20._0_13_ = auVar14;
  auVar19._13_3_ = auVar20._13_3_;
  auVar19[0xc] = cVar25;
  auVar19._0_12_ = auVar13;
  auVar18._12_4_ = auVar19._12_4_;
  auVar18[0xb] = cVar24;
  auVar18._0_11_ = auVar12;
  auVar17._11_5_ = auVar18._11_5_;
  auVar17[10] = cVar24;
  auVar17._0_10_ = auVar12._0_10_;
  auVar16._10_6_ = auVar17._10_6_;
  auVar16[9] = cVar23;
  auVar15._8_8_ = (undefined8)(CONCAT72(auVar16._9_7_,CONCAT11(cVar23,bVar26)) >> 8);
  auVar15[7] = cVar22;
  auVar15[6] = cVar22;
  auVar15[5] = -(uVar4 == uVar2._2_1_);
  auVar15[4] = -(uVar4 == uVar2._2_1_);
  auVar15[3] = -(uVar3 == uVar2._1_1_);
  auVar15[2] = -(uVar3 == uVar2._1_1_);
  auVar15[1] = auVar15[0];
  auVar9 = pshuflw(auVar9,auVar15,0x50);
  auVar10._0_4_ = auVar9._0_4_;
  auVar10._4_4_ = auVar10._0_4_;
  auVar10._8_4_ = auVar9._4_4_;
  auVar10._12_4_ = auVar9._4_4_;
  uVar7 = movmskpd(CONCAT31((int3)((uint)in_EAX >> 8),bVar6),auVar10);
  return (char)uVar7 == '\x03' && ((char)uVar8 == '\x0f' && bVar6 == 0);
}

Assistant:

bool EngineFuelReload::operator ==(const EngineFuelReload& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_standardQuantity == rhs._standardQuantity) ) ivarsEqual = false;
     if( ! (_maximumQuantity == rhs._maximumQuantity) ) ivarsEqual = false;
     if( ! (_standardQuantityReloadTime == rhs._standardQuantityReloadTime) ) ivarsEqual = false;
     if( ! (_maximumQuantityReloadTime == rhs._maximumQuantityReloadTime) ) ivarsEqual = false;
     if( ! (_fuelMeasurmentUnits == rhs._fuelMeasurmentUnits) ) ivarsEqual = false;
     if( ! (_fuelLocation == rhs._fuelLocation) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

    return ivarsEqual;
 }